

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O2

void S2::ValidFaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  VType *pVVar1;
  long lVar2;
  double dVar3;
  VType VVar4;
  S2LogMessage SStack_48;
  D local_38;
  
  lVar2 = (long)face * 0x48;
  local_38.c_[2] = *(VType *)(internal::kFaceUVWAxes + lVar2 + 0x40);
  local_38.c_[0] = *(VType *)(internal::kFaceUVWAxes + lVar2 + 0x30);
  local_38.c_[1] = *(VType *)(internal::kFaceUVWAxes + lVar2 + 0x38);
  dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)p,&local_38);
  if (dVar3 <= 0.0) {
    S2LogMessage::S2LogMessage
              (&SStack_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
               ,0x16d,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_48.stream_,"Check failed: (p.DotProd(GetNorm(face))) > (0) ");
    abort();
  }
  switch(face) {
  case 0:
    *pu = p->c_[1] / p->c_[0];
    VVar4 = p->c_[2];
    break;
  case 1:
    *pu = -p->c_[0] / p->c_[1];
    VVar4 = p->c_[2];
    p = (S2Point *)(p->c_ + 1);
    break;
  case 2:
    *pu = -p->c_[0] / p->c_[2];
    VVar4 = p->c_[1];
    goto LAB_001deda7;
  case 3:
    *pu = p->c_[2] / p->c_[0];
    VVar4 = p->c_[1];
    break;
  case 4:
    *pu = p->c_[2] / p->c_[1];
    pVVar1 = p->c_;
    p = (S2Point *)(p->c_ + 1);
    VVar4 = -*pVVar1;
    break;
  default:
    *pu = -p->c_[1] / p->c_[2];
    VVar4 = p->c_[0];
LAB_001deda7:
    p = (S2Point *)(p->c_ + 2);
    VVar4 = -VVar4;
  }
  *pv = VVar4 / p->c_[0];
  return;
}

Assistant:

inline void ValidFaceXYZtoUV(int face, const S2Point& p,
                             double* pu, double* pv) {
  S2_DCHECK_GT(p.DotProd(GetNorm(face)), 0);
  switch (face) {
    case 0:  *pu =  p[1] / p[0]; *pv =  p[2] / p[0]; break;
    case 1:  *pu = -p[0] / p[1]; *pv =  p[2] / p[1]; break;
    case 2:  *pu = -p[0] / p[2]; *pv = -p[1] / p[2]; break;
    case 3:  *pu =  p[2] / p[0]; *pv =  p[1] / p[0]; break;
    case 4:  *pu =  p[2] / p[1]; *pv = -p[0] / p[1]; break;
    default: *pu = -p[1] / p[2]; *pv = -p[0] / p[2]; break;
  }
}